

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dungeon.c
# Opt level: O0

void save_d_flags(memfile *mf,d_flags f)

{
  uint dflags;
  memfile *mf_local;
  d_flags f_local;
  
  mf_local._4_1_ = f._0_1_;
  mwrite32(mf,(uint)(mf_local._4_1_ & 1) << 0x1f | (uint)(mf_local._4_1_ >> 1 & 1) << 0x1e |
              (uint)(mf_local._4_1_ >> 2 & 1) << 0x1d | (uint)(mf_local._4_1_ >> 3 & 1) << 0x1c |
              (uint)(mf_local._4_1_ >> 4 & 7) << 0x19);
  return;
}

Assistant:

void save_d_flags(struct memfile *mf, d_flags f)
{
    unsigned int dflags;
    
    /* bitfield layouts are architecture and compiler-dependent, so d_flags can't be written directly */
    dflags = (f.town << 31) | (f.hellish << 30) | (f.maze_like << 29) |
             (f.rogue_like << 28) | (f.align << 25);
    mwrite32(mf, dflags);
}